

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O3

int Mecab_load(Mecab *m,char *dicdir)

{
  int iVar1;
  int iVar2;
  char **argv;
  char *pcVar3;
  Model *pMVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  
  if ((dicdir != (char *)0x0 && m != (Mecab *)0x0) && (*dicdir != '\0')) {
    Mecab_clear(m);
    argv = (char **)malloc(0x18);
    pcVar3 = strdup("mecab");
    *argv = pcVar3;
    pcVar3 = strdup("-d");
    argv[1] = pcVar3;
    pcVar3 = strdup(dicdir);
    argv[2] = pcVar3;
    pMVar4 = MeCab::createModel(3,argv);
    lVar5 = 0;
    do {
      free(argv[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    free(argv);
    if (pMVar4 != (Model *)0x0) {
      iVar1 = (*pMVar4->_vptr_Model[3])(pMVar4);
      if ((void *)CONCAT44(extraout_var,iVar1) != (void *)0x0) {
        iVar2 = (*pMVar4->_vptr_Model[4])(pMVar4);
        if ((void *)CONCAT44(extraout_var_00,iVar2) != (void *)0x0) {
          m->model = pMVar4;
          m->tagger = (void *)CONCAT44(extraout_var,iVar1);
          m->lattice = (void *)CONCAT44(extraout_var_00,iVar2);
          return 1;
        }
        Mecab_load_cold_1();
        return 0;
      }
      (*pMVar4->_vptr_Model[7])(pMVar4);
    }
    fprintf(_stderr,"ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n",dicdir);
  }
  return 0;
}

Assistant:

BOOL Mecab_load(Mecab *m, const char *dicdir)
{
   int i;
   int argc = 3;
   char **argv;

   if(m == NULL)
      return FALSE;

   if(dicdir == NULL || strlen(dicdir) == 0)
      return FALSE;

   Mecab_clear(m);

   argv = (char **) malloc(sizeof(char *) * argc);

   argv[0] = strdup("mecab");
   argv[1] = strdup("-d");
   argv[2] = strdup(dicdir);

   MeCab::Model *model = MeCab::createModel(argc, argv);

   for(i = 0; i < argc; i++)
      free(argv[i]);
   free(argv);

   if(model == NULL) {
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   MeCab::Tagger *tagger = model->createTagger();
   if(tagger == NULL) {
      delete model;
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   MeCab::Lattice *lattice = model->createLattice();
   if(lattice == NULL) {
      delete model;
      delete tagger;
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   m->model = (void *) model;
   m->tagger = (void *) tagger;
   m->lattice = (void *) lattice;

   return TRUE;
}